

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMPCG.cpp
# Opt level: O0

void __thiscall phaeton::OMPCG::visitContractionExpr(OMPCG *this,ContractionExpr *ContrExpr)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  ExpressionNode *Node;
  ExpressionNode *Node_00;
  ExpressionNode *Node_01;
  vector<int,_std::allocator<int>_> *ExprDims_00;
  ExpressionNode *pEVar4;
  vector<int,_std::allocator<int>_> *this_00;
  ulong uVar5;
  List *pLVar6;
  size_type sVar7;
  const_reference pvVar8;
  reference pvVar9;
  string *__lhs;
  int local_404;
  undefined1 local_400 [4];
  int I_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  allocator local_379;
  string local_378;
  int local_354;
  undefined1 local_350 [4];
  int I_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  allocator local_2a9;
  string local_2a8;
  string local_288;
  string local_268;
  undefined1 local_248 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  SavedExprIndices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  allocator local_1c9;
  string local_1c8;
  undefined1 local_1a8 [8];
  string Index_2;
  int I_2;
  int ContrIndexCounter_1;
  string Index_1;
  int local_158;
  int I_1;
  int ContrIndexCounter;
  int ExprIndexCounter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RHSIndices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  LHSIndices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  value_type *local_e0;
  string *Index;
  undefined1 local_d0 [4];
  int I;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ContrIndices;
  vector<int,_std::allocator<int>_> *RHSDims;
  vector<int,_std::allocator<int>_> *LHSDims;
  vector<int,_std::allocator<int>_> *ExprDims;
  ExpressionNode *RHSExpr;
  ExpressionNode *LHSExpr;
  undefined1 local_80 [8];
  string Tmp;
  string RHSTmp;
  string LHSTmp;
  ExpressionNode *Result;
  ContractionExpr *ContrExpr_local;
  OMPCG *this_local;
  
  iVar3 = ExpressionNode::getNumChildren(&ContrExpr->super_ExpressionNode);
  if (iVar3 != 2) {
    __assert_fail("ContrExpr->getNumChildren() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lijiansong[P]Phaeton/lib/Target/OMPCG.cpp"
                  ,0x324,
                  "virtual void phaeton::OMPCG::visitContractionExpr(const ContractionExpr *)");
  }
  Node = getResultTmp(this);
  std::__cxx11::string::string((string *)(RHSTmp.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(Tmp.field_2._M_local_buf + 8));
  getTmp_abi_cxx11_((string *)local_80,this);
  Node_00 = ExpressionNode::getChild(&ContrExpr->super_ExpressionNode,0);
  Node_01 = ExpressionNode::getChild(&ContrExpr->super_ExpressionNode,1);
  ExprDims_00 = getDims(this,&ContrExpr->super_ExpressionNode);
  pEVar4 = ExpressionNode::getChild(&ContrExpr->super_ExpressionNode,0);
  this_00 = getDims(this,pEVar4);
  pEVar4 = ExpressionNode::getChild(&ContrExpr->super_ExpressionNode,1);
  ContrIndices.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)getDims(this,pEVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0);
  Index._4_4_ = 0;
  while( true ) {
    uVar5 = (ulong)Index._4_4_;
    pLVar6 = ContractionExpr::getLeftIndices(ContrExpr);
    sVar7 = std::vector<int,_std::allocator<int>_>::size(pLVar6);
    if (sVar7 <= uVar5) break;
    getIndex_abi_cxx11_((string *)
                        &LHSIndices.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
    std::operator+(&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &LHSIndices.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"_contr");
    std::__cxx11::string::~string
              ((string *)
               &LHSIndices.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_e0 = &local_100;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d0,local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    Index._4_4_ = Index._4_4_ + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&RHSIndices.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ContrIndexCounter);
  I_1 = 0;
  local_158 = 0;
  Index_1.field_2._12_4_ = 0;
  while( true ) {
    uVar5 = (ulong)(int)Index_1.field_2._12_4_;
    sVar7 = std::vector<int,_std::allocator<int>_>::size(this_00);
    if (sVar7 <= uVar5) break;
    std::__cxx11::string::string((string *)&I_2);
    pLVar6 = ContractionExpr::getLeftIndices(ContrExpr);
    sVar7 = std::vector<int,_std::allocator<int>_>::size(pLVar6);
    uVar2 = Index_1.field_2._12_4_;
    if ((ulong)(long)local_158 < sVar7) {
      pLVar6 = ContractionExpr::getLeftIndices(ContrExpr);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pLVar6,(long)local_158);
      if (uVar2 != *pvVar8) goto LAB_001683fb;
      sVar7 = (size_type)local_158;
      local_158 = local_158 + 1;
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_d0,sVar7);
      std::__cxx11::string::operator=((string *)&I_2,(string *)pvVar9);
    }
    else {
LAB_001683fb:
      sVar7 = (size_type)I_1;
      I_1 = I_1 + 1;
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->ExprIndices,sVar7);
      std::__cxx11::string::operator=((string *)&I_2,(string *)pvVar9);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&RHSIndices.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&I_2);
    std::__cxx11::string::~string((string *)&I_2);
    Index_1.field_2._12_4_ = Index_1.field_2._12_4_ + 1;
  }
  Index_2.field_2._12_4_ = 0;
  Index_2.field_2._8_4_ = 0;
  do {
    uVar5 = (ulong)(int)Index_2.field_2._8_4_;
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       ContrIndices.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar7 <= uVar5) {
      emitLoopHeaderNest(this,ExprDims_00,false,true);
      uVar1 = this->NestLevel;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c8,(ulong)(uVar1 * 2),' ',&local_1c9);
      appendCode(this,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      __lhs = getFloatPointTypeName_abi_cxx11_(this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &SavedExprIndices.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,__lhs," ");
      std::operator+(&local_210,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &SavedExprIndices.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::operator+(&local_1f0,&local_210," = 0.0;\n");
      appendCode(this,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string
                ((string *)
                 &SavedExprIndices.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_248,&this->ExprIndices);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->ExprIndices,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&RHSIndices.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      visitChildExpr_abi_cxx11_(&local_268,this,Node_00);
      std::__cxx11::string::operator=
                ((string *)(RHSTmp.field_2._M_local_buf + 8),(string *)&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      emitLoopHeaderNest(this,this_00,false,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->ExprIndices,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&ContrIndexCounter);
      visitChildExpr_abi_cxx11_(&local_288,this,Node_01);
      std::__cxx11::string::operator=((string *)(Tmp.field_2._M_local_buf + 8),(string *)&local_288)
      ;
      std::__cxx11::string::~string((string *)&local_288);
      emitLoopHeaderNest(this,(vector<int,_std::allocator<int>_> *)
                              ContrIndices.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,false,false);
      uVar1 = this->NestLevel;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2a8,(ulong)(uVar1 * 2),' ',&local_2a9);
      appendCode(this,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     " += ");
      std::operator+(&local_330,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_350,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&RHSTmp.field_2 + 8));
      std::operator+(&local_310,&local_330," * ");
      std::operator+(&local_2f0,&local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&Tmp.field_2 + 8));
      std::operator+(&local_2d0,&local_2f0,";\n");
      appendCode(this,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)local_350);
      local_354 = 0;
      while( true ) {
        uVar5 = (ulong)local_354;
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_d0);
        if (sVar7 <= uVar5) break;
        this->NestLevel = this->NestLevel - 1;
        emitForLoopFooter(this,this->NestLevel * 2);
        local_354 = local_354 + 1;
      }
      uVar1 = this->NestLevel;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_378,(ulong)(uVar1 * 2),' ',&local_379);
      appendCode(this,&local_378);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
      subscriptedIdentifier((string *)local_400,this,Node,&this->ResultIndices);
      std::operator+(&local_3e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400,
                     " = ");
      std::operator+(&local_3c0,&local_3e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::operator+(&local_3a0,&local_3c0,";\n");
      appendCode(this,&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)local_400);
      local_404 = 0;
      while( true ) {
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_d0);
        if (sVar7 <= (ulong)(long)local_404) break;
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_d0,(long)local_404);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(&this->LoopedOverIndices,pvVar9);
        local_404 = local_404 + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->ExprIndices,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_248);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_248);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ContrIndexCounter);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&RHSIndices.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d0);
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)(Tmp.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(RHSTmp.field_2._M_local_buf + 8));
      return;
    }
    std::__cxx11::string::string((string *)local_1a8);
    uVar5 = (ulong)(int)Index_2.field_2._12_4_;
    pLVar6 = ContractionExpr::getRightIndices(ContrExpr);
    sVar7 = std::vector<int,_std::allocator<int>_>::size(pLVar6);
    uVar2 = Index_2.field_2._8_4_;
    if (uVar5 < sVar7) {
      pLVar6 = ContractionExpr::getRightIndices(ContrExpr);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pLVar6,(long)(int)Index_2.field_2._12_4_);
      if (uVar2 != *pvVar8) goto LAB_00168581;
      sVar7 = (size_type)(int)Index_2.field_2._12_4_;
      Index_2.field_2._12_4_ = Index_2.field_2._12_4_ + 1;
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_d0,sVar7);
      std::__cxx11::string::operator=((string *)local_1a8,(string *)pvVar9);
    }
    else {
LAB_00168581:
      sVar7 = (size_type)I_1;
      I_1 = I_1 + 1;
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->ExprIndices,sVar7);
      std::__cxx11::string::operator=((string *)local_1a8,(string *)pvVar9);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ContrIndexCounter,(value_type *)local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    Index_2.field_2._8_4_ = Index_2.field_2._8_4_ + 1;
  } while( true );
}

Assistant:

void OMPCG::visitContractionExpr(const ContractionExpr *ContrExpr) {
  assert(ContrExpr->getNumChildren() == 2);

  const ExpressionNode *Result = getResultTmp();
  std::string LHSTmp, RHSTmp;
  const std::string Tmp = getTmp();

  // Here 'LHS' and 'RHS' for contraction expression means its two operand.
  const ExpressionNode *LHSExpr = ContrExpr->getChild(0);
  const ExpressionNode *RHSExpr = ContrExpr->getChild(1);

  const std::vector<int> &ExprDims = getDims(ContrExpr);
  const std::vector<int> &LHSDims = getDims(ContrExpr->getChild(0));
  const std::vector<int> &RHSDims = getDims(ContrExpr->getChild(1));

  std::vector<std::string> ContrIndices;
  for (int I = 0; I < ContrExpr->getLeftIndices().size(); ++I) {
    const std::string &Index = getIndex() + "_contr";
    ContrIndices.push_back(Index);
  }

  std::vector<std::string> LHSIndices, RHSIndices;
  int ExprIndexCounter = 0;
  // Here we need to determine which indices belong to 'LHS', i.e. the first
  // operand.
  {
    int ContrIndexCounter = 0;
    for (int I = 0; I < LHSDims.size(); ++I) {
      std::string Index;
      if (ContrIndexCounter < ContrExpr->getLeftIndices().size() &&
          I == ContrExpr->getLeftIndices()[ContrIndexCounter]) {
        Index = ContrIndices[ContrIndexCounter++];
      } else {
        Index = ExprIndices[ExprIndexCounter++];
      }
      LHSIndices.push_back(Index);
    }
  }
  // Here we need to determine which indices belong to 'RHS', i.e. the second
  // operand.
  {
    int ContrIndexCounter = 0;
    for (int I = 0; I < RHSDims.size(); ++I) {
      std::string Index;
      if (ContrIndexCounter < ContrExpr->getRightIndices().size() &&
          I == ContrExpr->getRightIndices()[ContrIndexCounter]) {
        Index = ContrIndices[ContrIndexCounter++];
      } else {
        Index = ExprIndices[ExprIndexCounter++];
      }
      RHSIndices.push_back(Index);
    }
  }

  // Here we need to emit for loop nest for result.
  emitLoopHeaderNest(ExprDims, /*Unroll=*/false, /*Simd=*/true);

  OMP_CG_INDENT(NestLevel * OMP_INDENT_PER_LEVEL);
  // FIXME: for different we need to determine the zero format for different
  // kind float point numbers.
  appendCode(getFloatPointTypeName() + " " + Tmp + " = 0.0;\n");

  const std::vector<std::string> SavedExprIndices = ExprIndices;
  // Here we visit 'LHS'.
  ExprIndices = LHSIndices;
  LHSTmp = visitChildExpr(LHSExpr);
  // Here we emit for loop nest for 'LHS' early.
  emitLoopHeaderNest(LHSDims, /*Unroll=*/false, /*Simd=*/false);
  // Here we visit 'RHS' and emit loop headers as necessary.
  ExprIndices = RHSIndices;
  RHSTmp = visitChildExpr(RHSExpr);
  // Here we emit for loop nest for 'RHS'.
  emitLoopHeaderNest(RHSDims, /*Unroll=*/false, /*Simd=*/false);

  OMP_CG_INDENT(NestLevel * OMP_INDENT_PER_LEVEL);
  appendCode(Tmp + " += " + LHSTmp + " * " + RHSTmp + ";\n");

  // 1. We need to close those for loops that iterate over those contracted
  // indices.
  for (int I = 0; I < ContrIndices.size(); ++I) {
    --NestLevel;
    emitForLoopFooter(NestLevel * OMP_INDENT_PER_LEVEL);
  }

  OMP_CG_INDENT(NestLevel * OMP_INDENT_PER_LEVEL);
  appendCode(subscriptedIdentifier(Result, ResultIndices) + " = " + Tmp +
             ";\n");

  // 2. Then we need to remove contracted indices from 'LoopedOverIndices'.
  for (int I = 0; I < ContrIndices.size(); ++I) {
    LoopedOverIndices.erase(ContrIndices[I]);
  }

  ExprIndices = SavedExprIndices;
}